

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O3

EStatusCode __thiscall
AbstractContentContext::DrawCircle
          (AbstractContentContext *this,double inCenterX,double inCenterY,double inRadius,
          GraphicOptions *inOptions)

{
  char *pcVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar3;
  int in_R8D;
  int in_R9D;
  
  pvVar3 = (void *)(ulong)inOptions->drawingType;
  pcVar1 = (char *)(ulong)inOptions->colorSpace;
  SetupColor(this,inOptions->drawingType,inOptions->colorValue,inOptions->colorSpace,
             inOptions->opacity);
  iVar2 = extraout_EDX;
  if (inOptions->drawingType == eStroke) {
    w(this,inOptions->strokeWidth);
    iVar2 = extraout_EDX_00;
  }
  m(this,pvVar3,iVar2,pcVar1,in_R8D,in_R9D);
  c(this,pvVar3,extraout_RDX);
  c(this,pvVar3,extraout_RDX_00);
  c(this,pvVar3,extraout_RDX_01);
  c(this,pvVar3,extraout_RDX_02);
  FinishPath(this,inOptions);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::DrawCircle(double inCenterX,double inCenterY,double inRadius,const GraphicOptions& inOptions)
{
    const double magic = 0.551784;
    double x = inCenterX;
    double y = inCenterY;
    double r = inRadius;
    double rmagic = r * magic;
    
	SetupColor(inOptions);
	if(inOptions.drawingType == eStroke)
		w(inOptions.strokeWidth);
    m(x-r,y);
    c(x-r,y+rmagic,x-rmagic,y+r,x,y+r);
    c(x+rmagic,y+r,x+r,y+rmagic,x+r,y);
    c(x+r,y-rmagic,x+rmagic,y-r,x,y-r);
    c(x-rmagic,y-r,x-r,y-rmagic,x-r,y);
	FinishPath(inOptions);	
	return GetCurrentStatusCode();
}